

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerInvisibility::DoEffect(APowerInvisibility *this)

{
  int iVar1;
  AActor *pAVar2;
  double dVar3;
  double local_18;
  double ts;
  APowerInvisibility *this_local;
  
  APowerup::DoEffect(&this->super_APowerup);
  local_18 = ((this->super_APowerup).Strength / 100.0) *
             (double)((this->super_APowerup).super_AInventory.super_AActor.special1 + 1);
  if (1.0 < local_18) {
    local_18 = 1.0;
  }
  dVar3 = clamp<double>(1.0 - local_18,0.0,1.0);
  pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  pAVar2->Alpha = dVar3;
  iVar1 = FName::operator_cast_to_int(&(this->super_APowerup).Mode.super_FName);
  if (iVar1 != 0) {
    if (iVar1 == 0x13) {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_Add);
      return;
    }
    if (iVar1 != 0x14) {
      if (iVar1 == 0x15) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_OptFuzzy);
        return;
      }
      if (iVar1 == 0x16) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_Normal);
        return;
      }
      if (iVar1 == 0x17) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_Stencil);
        return;
      }
      if (iVar1 == 0x18) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_AddStencil);
        return;
      }
      if (iVar1 == 0x1f) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=
                  ((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_TranslucentStencil);
        return;
      }
      if (iVar1 != 0x14d) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_Normal);
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        pAVar2->Alpha = 1.0;
        return;
      }
    }
  }
  pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
  FRenderStyle::operator=((FRenderStyle *)&(pAVar2->RenderStyle).field_0,STYLE_Translucent);
  return;
}

Assistant:

void APowerInvisibility::DoEffect ()
{
	Super::DoEffect();
	// Due to potential interference with other PowerInvisibility items
	// the effect has to be refreshed each tic.
	double ts = (Strength / 100) * (special1 + 1);
	
	if (ts > 1.) ts = 1.;
	Owner->Alpha = clamp((1. - ts), 0., 1.);
	switch (Mode)
	{
	case (NAME_Fuzzy):
		Owner->RenderStyle = STYLE_OptFuzzy;
		break;
	case (NAME_Opaque):
		Owner->RenderStyle = STYLE_Normal;
		break;
	case (NAME_Additive):
		Owner->RenderStyle = STYLE_Add;
		break;
	case (NAME_Stencil):
		Owner->RenderStyle = STYLE_Stencil;
		break;
	case (NAME_AddStencil) :
		Owner->RenderStyle = STYLE_AddStencil;
		break;
	case (NAME_TranslucentStencil) :
		Owner->RenderStyle = STYLE_TranslucentStencil;
		break;
	case (NAME_None) :
	case (NAME_Cumulative):
	case (NAME_Translucent):
		Owner->RenderStyle = STYLE_Translucent;
		break;
	default: // Something's wrong
		Owner->RenderStyle = STYLE_Normal;
		Owner->Alpha = 1.;
		break;
	}
}